

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

void __thiscall LatencyItem::~LatencyItem(LatencyItem *this)

{
  HistBin *pHVar1;
  pointer pcVar2;
  
  pHVar1 = (this->hist).bins;
  if (pHVar1 != (HistBin *)0x0) {
    operator_delete__(pHVar1);
  }
  pcVar2 = (this->statName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->statName).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

LatencyItem() {}